

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_KVDataTest_SkipKVData_Test::TestBody
          (ktxTexture_KVDataTest_SkipKVData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  AssertHelper *this_00;
  AssertHelper *in_RDI;
  undefined1 uVar4;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffe88) [37];
  AssertionResult *in_stack_fffffffffffffe90;
  ktx_error_code_e *in_stack_fffffffffffffe98;
  Message *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  int line;
  Message *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  Type type;
  string local_138 [40];
  char *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  char *in_stack_ffffffffffffff00;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult local_b8;
  uint local_a4;
  string local_a0 [40];
  undefined8 local_78;
  undefined1 local_61;
  AssertionResult local_60 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  undefined4 local_14;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_10[0] = 0;
  if ((((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&in_RDI[0x34].data_)->_M_t).
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_14 = ktxTexture_CreateFromMemory
                         ((((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&in_RDI[0x34].data_)->_M_t).
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,
                          (((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&in_RDI[0x35].data_)->_M_t).
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,4,local_10);
    local_2c = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
               ,(ktx_error_code_e *)in_stack_fffffffffffffe90);
    line = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
    if (!bVar1) {
      testing::Message::Message((Message *)in_RDI);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1342dc);
      type = (Type)((ulong)pcVar2 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (in_RDI,type,(char *)in_stack_fffffffffffffeb0,line,
                 (char *)in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      testing::Message::~Message((Message *)0x134339);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1343a7);
    local_61 = local_10[0] != 0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffe90,(bool *)in_stack_fffffffffffffe88,(type *)0x1343d5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_RDI);
      in_stack_fffffffffffffeb0 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      uVar3 = ktxErrorString(local_14);
      local_78 = uVar3;
      in_stack_fffffffffffffea0 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe90,(char **)in_stack_fffffffffffffe88);
      line = (int)((ulong)uVar3 >> 0x20);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_ffffffffffffff08._M_head_impl,in_stack_ffffffffffffff00
                 ,(char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_RDI,type,(char *)in_stack_fffffffffffffeb0,line,
                 (char *)in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      std::__cxx11::string::~string(local_a0);
      testing::Message::~Message((Message *)0x1344f9);
    }
    local_a4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1345a3);
    if (local_a4 == 0) {
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffffe90,(bool *)in_stack_fffffffffffffe88,(type *)0x1345e7);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_RDI);
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffe90,(char (*) [32])in_stack_fffffffffffffe88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)in_stack_ffffffffffffff08._M_head_impl,
                   in_stack_ffffffffffffff00,
                   (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef0);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_RDI,type,(char *)in_stack_fffffffffffffeb0,line,
                   (char *)in_stack_fffffffffffffea0);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
        testing::Message::~Message((Message *)0x1346d2);
      }
      local_a4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13477c);
      if (local_a4 == 0) {
        uVar4 = *(long *)(local_10[0] + 0x50) == 0;
        testing::AssertionResult::AssertionResult<bool>
                  (in_stack_fffffffffffffe90,(bool *)in_stack_fffffffffffffe88,(type *)0x1347b7);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffff00);
        if (!bVar1) {
          testing::Message::Message((Message *)in_RDI);
          this_00 = (AssertHelper *)
                    testing::Message::operator<<
                              ((Message *)in_stack_fffffffffffffe90,
                               (char (*) [34])in_stack_fffffffffffffe88);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)in_stack_ffffffffffffff08._M_head_impl,
                     in_stack_ffffffffffffff00,(char *)CONCAT17(uVar4,in_stack_fffffffffffffef8),
                     in_stack_fffffffffffffef0);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_RDI,type,(char *)in_stack_fffffffffffffeb0,line,
                     (char *)in_stack_fffffffffffffea0);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper(this_00);
          std::__cxx11::string::~string(local_138);
          testing::Message::~Message((Message *)0x134881);
        }
        local_a4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x13491f);
        if ((local_a4 == 0) && (local_10[0] != 0)) {
          (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture_KVDataTest, SkipKVData) {
    ktxTexture* texture = 0;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             KTX_TEXTURE_CREATE_SKIP_KVDATA_BIT,
                                             &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->kvData == NULL) << "Raw KVData should not be loaded";
        ASSERT_TRUE(texture->kvDataHead == NULL) << "KVData should not be deserialized";
        if (texture)
            ktxTexture_Destroy(texture);
    }
}